

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Value __thiscall
Catch::RunContext::acceptExpression
          (RunContext *this,ExpressionResultBuilder *assertionResult,AssertionInfo *assertionInfo)

{
  Value VVar1;
  AssertionResult *in_RDI;
  AssertionInfo *in_stack_00000020;
  ExpressionResultBuilder *in_stack_00000028;
  AssertionInfo *in_stack_ffffffffffffff08;
  AssertionResult *result;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  AssertionResult local_d0;
  
  AssertionInfo::operator=(&in_RDI->m_info,in_stack_ffffffffffffff08);
  result = &local_d0;
  ExpressionResultBuilder::buildResult(in_stack_00000028,in_stack_00000020);
  VVar1 = actOnCurrentResult((RunContext *)
                             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),result);
  AssertionResult::~AssertionResult(in_RDI);
  return VVar1;
}

Assistant:

virtual ResultAction::Value acceptExpression( ExpressionResultBuilder const& assertionResult, AssertionInfo const& assertionInfo ) {
            m_lastAssertionInfo = assertionInfo;
            return actOnCurrentResult( assertionResult.buildResult( assertionInfo ) );
        }